

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ConstraintDeclarationSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ConstraintDeclarationSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  ConstraintBlockSyntax *node_00;
  SyntaxNode *local_60;
  SyntaxNode *local_50;
  size_t index_local;
  ConstraintDeclarationSyntax *this_local;
  
  switch(index) {
  case 0:
    local_50 = (SyntaxNode *)0x0;
    if (this != (ConstraintDeclarationSyntax *)0xfffffffffffffff0) {
      local_50 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_50);
    break;
  case 1:
    local_60 = (SyntaxNode *)0x0;
    if (this != (ConstraintDeclarationSyntax *)0xffffffffffffffc0) {
      local_60 = &(this->qualifiers).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 2:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    node = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::get(&this->name);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 4:
    node_00 = not_null<slang::syntax::ConstraintBlockSyntax_*>::get(&this->block);
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)node_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ConstraintDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &qualifiers;
        case 2: return keyword;
        case 3: return name.get();
        case 4: return block.get();
        default: return nullptr;
    }
}